

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O2

void glesv2_gears_draw(gears_t_conflict1 *gears,float view_tz,float view_rx,float view_ry,
                      float model_rz)

{
  float *a;
  float blue [4];
  float green [4];
  float red [4];
  
  red[0] = 0.8;
  red[1] = 0.1;
  red[2] = 0.0;
  red[3] = 1.0;
  green[0] = 0.0;
  green[1] = 0.8;
  green[2] = 0.2;
  green[3] = 1.0;
  blue[0] = 0.2;
  blue[1] = 0.2;
  blue[2] = 1.0;
  blue[3] = 1.0;
  if (gears != (gears_t_conflict1 *)0x0) {
    (*gears->glClear)(0x4100);
    a = gears->View;
    gears->View[0] = 1.0;
    gears->View[1] = 0.0;
    gears->View[2] = 0.0;
    gears->View[3] = 0.0;
    gears->View[4] = 0.0;
    gears->View[5] = 1.0;
    gears->View[6] = 0.0;
    gears->View[7] = 0.0;
    gears->View[8] = 0.0;
    gears->View[9] = 0.0;
    gears->View[10] = 1.0;
    gears->View[0xb] = 0.0;
    gears->View[0xc] = 0.0;
    gears->View[0xd] = 0.0;
    gears->View[0xe] = 0.0;
    gears->View[0xf] = 1.0;
    translate(a,0.0,0.0,view_tz);
    rotate(a,view_rx,1.0,0.0,0.0);
    rotate(a,view_ry,0.0,1.0,0.0);
    draw_gear(gears,0,-3.0,-2.0,model_rz,red);
    draw_gear(gears,1,3.1,-2.0,model_rz * -2.0 + -9.0,green);
    draw_gear(gears,2,-3.1,4.2,model_rz * -2.0 + -25.0,blue);
  }
  return;
}

Assistant:

static void glesv2_gears_draw(gears_t *gears, float view_tz, float view_rx, float view_ry, float model_rz)
{
  const float red[4] = { 0.8, 0.1, 0.0, 1.0 };
  const float green[4] = { 0.0, 0.8, 0.2, 1.0 };
  const float blue[4] = { 0.2, 0.2, 1.0, 1.0 };

  if (!gears) {
    return;
  }

  gears->glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  identity(gears->View);
  translate(gears->View, 0, 0, view_tz);
  rotate(gears->View, view_rx, 1, 0, 0);
  rotate(gears->View, view_ry, 0, 1, 0);

  draw_gear(gears, GEAR0, -3.0, -2.0,      model_rz     , red);
  draw_gear(gears, GEAR1,  3.1, -2.0, -2 * model_rz - 9 , green);
  draw_gear(gears, GEAR2, -3.1,  4.2, -2 * model_rz - 25, blue);
}